

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O2

void prng_seed_begin(prng *pr)

{
  ssh_hash *psVar1;
  
  if (pr[2].savesize == 0) {
    psVar1 = (ssh_hash *)pr[1].binarysink_[0].write;
    if (psVar1 == (ssh_hash *)0x0) {
      psVar1 = ssh_hash_new((ssh_hashalg *)pr[1].savesize);
    }
    else {
      pr[1].binarysink_[0].write = (_func_void_BinarySink_ptr_void_ptr_size_t *)0x0;
    }
    pr[2].savesize = (size_t)psVar1;
    BinarySink_put_byte(psVar1->binarysink_,'R');
    return;
  }
  __assert_fail("!pi->keymaker",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/prng.c",
                0x92,"void prng_seed_begin(prng *)");
}

Assistant:

void prng_seed_begin(prng *pr)
{
    prng_impl *pi = container_of(pr, prng_impl, Prng);

    assert(!pi->keymaker);

    prngdebug("prng: reseed begin\n");

    /*
     * Make a hash instance that will generate the key for the new one.
     */
    if (pi->generator) {
        pi->keymaker = pi->generator;
        pi->generator = NULL;
    } else {
        pi->keymaker = ssh_hash_new(pi->hashalg);
    }

    put_byte(pi->keymaker, 'R');
}